

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O2

void sysbvm_dwarf_cfi_beginFDE(sysbvm_dwarf_cfi_builder_t *cfi,size_t pc)

{
  size_t sVar1;
  
  sVar1 = sysbvm_dwarf_encodeDWord(&cfi->buffer,0);
  cfi->fdeOffset = sVar1;
  sVar1 = sysbvm_dwarf_encodeDwarfPointerPCRelative(&cfi->buffer,(uint32_t)cfi->cieOffset);
  cfi->fdeContentOffset = sVar1;
  cfi->fdeInitialPC = pc;
  if (cfi->isEhFrame == true) {
    sVar1 = sysbvm_dwarf_encodeDWord(&cfi->buffer,0);
    cfi->fdeInitialLocationOffset = sVar1;
    sVar1 = sysbvm_dwarf_encodeDWord(&cfi->buffer,0);
    cfi->fdeAddressingRangeOffset = sVar1;
    sysbvm_dwarf_encodeULEB128(&cfi->buffer,0);
  }
  else {
    sVar1 = sysbvm_dwarf_encodePointer(&cfi->buffer,0);
    cfi->fdeInitialLocationOffset = sVar1;
    sVar1 = sysbvm_dwarf_encodePointer(&cfi->buffer,0);
    cfi->fdeAddressingRangeOffset = sVar1;
  }
  cfi->currentPC = cfi->fdeInitialPC;
  cfi->stackFrameSize = cfi->initialStackFrameSize;
  cfi->framePointerRegister = 0;
  cfi->hasFramePointerRegister = false;
  cfi->isInPrologue = true;
  return;
}

Assistant:

SYSBVM_API void sysbvm_dwarf_cfi_beginFDE(sysbvm_dwarf_cfi_builder_t *cfi, size_t pc)
{
    cfi->fdeOffset = sysbvm_dwarf_encodeDWord(&cfi->buffer, 0);
    cfi->fdeContentOffset = sysbvm_dwarf_encodeDwarfPointerPCRelative(&cfi->buffer, (uint32_t)cfi->cieOffset);
    cfi->fdeInitialPC = pc;
    if(cfi->isEhFrame)
    {
        cfi->fdeInitialLocationOffset = sysbvm_dwarf_encodeDWord(&cfi->buffer, 0);
        cfi->fdeAddressingRangeOffset = sysbvm_dwarf_encodeDWord(&cfi->buffer, 0);
        sysbvm_dwarf_encodeULEB128(&cfi->buffer, 0);
    }
    else
    {
        cfi->fdeInitialLocationOffset = sysbvm_dwarf_encodePointer(&cfi->buffer, 0);
        cfi->fdeAddressingRangeOffset = sysbvm_dwarf_encodePointer(&cfi->buffer, 0);
    }
    cfi->currentPC = cfi->fdeInitialPC;
    cfi->stackFrameSize = cfi->initialStackFrameSize;
    cfi->framePointerRegister = 0;
    cfi->hasFramePointerRegister = false;
    cfi->isInPrologue = true;
}